

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

spirv_cross * __thiscall
spirv_cross::join<char_const*&,char_const(&)[22],char_const*&,char_const(&)[30]>
          (spirv_cross *this,char **ts,char (*ts_1) [22],char **ts_2,char (*ts_3) [30])

{
  undefined1 local_1120 [8];
  StringStream<4096UL,_4096UL> stream;
  char (*ts_local_3) [30];
  char **ts_local_2;
  char (*ts_local_1) [22];
  char **ts_local;
  
  stream.saved_buffers.stack_storage.aligned_char._184_8_ = ts_3;
  StringStream<4096UL,_4096UL>::StringStream((StringStream<4096UL,_4096UL> *)local_1120);
  inner::join_helper<char_const*&,char_const(&)[22],char_const*&,char_const(&)[30]>
            ((StringStream<4096UL,_4096UL> *)local_1120,ts,ts_1,ts_2,
             (char (*) [30])stream.saved_buffers.stack_storage.aligned_char._184_8_);
  StringStream<4096ul,4096ul>::str_abi_cxx11_((StringStream<4096ul,4096ul> *)this);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1120);
  return this;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}